

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O3

vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *
libtorrent::session_stats_metrics(void)

{
  int iVar1;
  long lVar2;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *in_RDI;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> local_28;
  
  local_28.super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::resize
            (&local_28,0x123);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)&(local_28.
              super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>
              ._M_impl.super__Vector_impl_data._M_start)->name + lVar2) =
         *(undefined8 *)((long)&(anonymous_namespace)::metrics + lVar2);
    iVar1 = *(int *)((long)&DAT_004e4028 + lVar2);
    *(int *)((long)&(local_28.
                     super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>
                     ._M_impl.super__Vector_impl_data._M_start)->value_index + lVar2) = iVar1;
    *(uint *)((long)&(local_28.
                      super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>
                      ._M_impl.super__Vector_impl_data._M_start)->type + lVar2) =
         (uint)(0xd2 < iVar1);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1230);
  (in_RDI->super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>).
  _M_impl.super__Vector_impl_data._M_start =
       local_28.
       super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (in_RDI->super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       local_28.
       super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (in_RDI->super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.
       super__Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  return in_RDI;
}

Assistant:

std::vector<stats_metric> session_stats_metrics()
	{
		aux::vector<stats_metric> stats;
		stats.resize(metrics.size());
		for (int i = 0; i < metrics.end_index(); ++i)
		{
			stats[i].name = metrics[i].name;
			stats[i].value_index = metrics[i].value_index;
			stats[i].type = metrics[i].value_index >= counters::num_stats_counters
				? metric_type_t::gauge : metric_type_t::counter;
		}
		return TORRENT_RVO(stats);
	}